

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetSpecsOf.hpp
# Opt level: O2

void __thiscall sciplot::OffsetSpecs::~OffsetSpecs(OffsetSpecs *this)

{
  ~OffsetSpecs(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

OffsetSpecsOf<DerivedSpecs>::OffsetSpecsOf()
{
}